

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_semantic_analysis.cpp
# Opt level: O0

compile_errcode __thiscall Statement::Action(Statement *this)

{
  SymbolName SVar1;
  compile_errcode cVar2;
  StatementList *pSVar3;
  allocator local_99;
  string local_98 [8];
  string str;
  undefined1 local_40 [4];
  SymbolName name;
  string funtion_name;
  SymbolType function_type;
  int ret;
  Statement *this_local;
  
  funtion_name.field_2._12_4_ = 0;
  funtion_name.field_2._8_4_ = SymbolTableTree::GetCurrentTableType(symbol_table_tree);
  SymbolTableTree::GetCurrentTableName_abi_cxx11_((string *)local_40,symbol_table_tree);
  SVar1 = SymbolQueue::GetCurrentName(handle_correct_queue);
  SymbolQueue::SetCacheLocate(handle_correct_queue);
  if (SVar1 == L_CURLY_BRACKET_SYM) {
    SymbolQueue::NextSymbol(handle_correct_queue);
    pSVar3 = (StatementList *)operator_new(0x1f0);
    StatementList::StatementList(pSVar3);
    this->m_statement_list_ptr = pSVar3;
    funtion_name.field_2._12_4_ =
         (*(this->m_statement_list_ptr->super_AnalysisInterface)._vptr_AnalysisInterface[2])();
    if (funtion_name.field_2._12_4_ == 0) {
      (*(this->m_statement_list_ptr->super_AnalysisInterface)._vptr_AnalysisInterface[1])();
      pSVar3 = this->m_statement_list_ptr;
      if (pSVar3 != (StatementList *)0x0) {
        StatementList::~StatementList(pSVar3);
        operator_delete(pSVar3);
      }
      SVar1 = SymbolQueue::GetCurrentName(handle_correct_queue);
      if (SVar1 != R_CURLY_BRACKET_SYM) {
        this_local._4_4_ = -1;
        goto LAB_00195565;
      }
      SymbolQueue::NextSymbol(handle_correct_queue);
LAB_00195557:
      this_local._4_4_ = 0;
      goto LAB_00195565;
    }
    pSVar3 = this->m_statement_list_ptr;
    if (pSVar3 != (StatementList *)0x0) {
      StatementList::~StatementList(pSVar3);
      operator_delete(pSVar3);
    }
  }
  else {
    funtion_name.field_2._12_4_ = OutputStatement::Action(&this->m_output_statement);
    if (funtion_name.field_2._12_4_ == 0) {
      OutputStatement::LogOutput(&this->m_output_statement);
    }
    else {
      SymbolQueue::SetCurrentLocate(handle_correct_queue);
      funtion_name.field_2._12_4_ = InputStatement::Action(&this->m_input_statement);
      if (funtion_name.field_2._12_4_ == 0) {
        InputStatement::LogOutput(&this->m_input_statement);
      }
      else {
        SymbolQueue::SetCurrentLocate(handle_correct_queue);
        std::__cxx11::string::string((string *)(str.field_2._M_local_buf + 8),(string *)local_40);
        cVar2 = ReturnStatement::Action
                          (&this->m_return_statement,
                           (SymbolType *)(funtion_name.field_2._M_local_buf + 8),
                           (string *)((long)&str.field_2 + 8));
        funtion_name.field_2._12_4_ = cVar2;
        std::__cxx11::string::~string((string *)(str.field_2._M_local_buf + 8));
        if (cVar2 == 0) {
          ReturnStatement::LogOutput(&this->m_return_statement);
        }
        else {
          SymbolQueue::SetCurrentLocate(handle_correct_queue);
          funtion_name.field_2._12_4_ = AssignStatement::Action(&this->m_assign_statement);
          if (funtion_name.field_2._12_4_ == 0) {
            AssignStatement::LogOutput(&this->m_assign_statement);
          }
          else {
            SymbolQueue::SetCurrentLocate(handle_correct_queue);
            funtion_name.field_2._12_4_ = FunctionCall::Action(&this->m_function_call);
            if (funtion_name.field_2._12_4_ != 0) {
              SymbolQueue::SetCurrentLocate(handle_correct_queue);
              funtion_name.field_2._12_4_ = ConditionStatement::Action(&this->m_condition_statement)
              ;
              if (funtion_name.field_2._12_4_ == 0) {
                ConditionStatement::LogOutput(&this->m_condition_statement);
              }
              else {
                SymbolQueue::SetCurrentLocate(handle_correct_queue);
                funtion_name.field_2._12_4_ =
                     WhileLoopStatement::Action(&this->m_while_loop_statement);
                if (funtion_name.field_2._12_4_ == 0) {
                  WhileLoopStatement::LogOutput(&this->m_while_loop_statement);
                }
                else {
                  SymbolQueue::SetCurrentLocate(handle_correct_queue);
                  funtion_name.field_2._12_4_ = SwitchStatement::Action(&this->m_switch_statement);
                  if (funtion_name.field_2._12_4_ != 0) {
                    SVar1 = SymbolQueue::GetCurrentName(handle_correct_queue);
                    if (SVar1 == SEMICOLON_SYM) {
                      SymbolQueue::NextSymbol(handle_correct_queue);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_98,"This is a empty statement",&local_99);
                      std::allocator<char>::~allocator((allocator<char> *)&local_99);
                      this_local._4_4_ = 0;
                      std::__cxx11::string::~string(local_98);
                    }
                    else {
                      this_local._4_4_ = -1;
                    }
                    goto LAB_00195565;
                  }
                  SwitchStatement::LogOutput(&this->m_switch_statement);
                }
              }
              goto LAB_00195557;
            }
            FunctionCall::LogOutput(&this->m_function_call);
          }
        }
      }
    }
  }
  SVar1 = SymbolQueue::GetCurrentName(handle_correct_queue);
  if (SVar1 == SEMICOLON_SYM) {
    SymbolQueue::NextSymbol(handle_correct_queue);
    this_local._4_4_ = 0;
  }
  else {
    fprintf(_stderr,"expected a \':\' in the end of statement\n");
    this_local._4_4_ = 0;
  }
LAB_00195565:
  std::__cxx11::string::~string((string *)local_40);
  return this_local._4_4_;
}

Assistant:

compile_errcode Statement::Action() {
    int ret = COMPILE_OK;
    SymbolType function_type;
    function_type = symbol_table_tree->GetCurrentTableType();
    string funtion_name = symbol_table_tree->GetCurrentTableName();
    SymbolName name = handle_correct_queue->GetCurrentName();
    handle_correct_queue->SetCacheLocate();
    if (name == L_CURLY_BRACKET_SYM) {
        handle_correct_queue->NextSymbol();
        m_statement_list_ptr = new StatementList;
        if ((ret = m_statement_list_ptr->Action()) == COMPILE_OK) {
            m_statement_list_ptr->LogOutput();
            delete(m_statement_list_ptr);
            name = handle_correct_queue->GetCurrentName();
            if (name == R_CURLY_BRACKET_SYM) {
                handle_correct_queue->NextSymbol();
                goto NO_SEMICOLON;
            } else {
                return NOT_MATCH;
            }
        } else {
            delete(m_statement_list_ptr);
            NOT_MATCH;
        }
    } else if ((ret = m_output_statement.Action()) == COMPILE_OK) {
        m_output_statement.LogOutput();
        goto SEMICOLON_CHECK;
    } else if (handle_correct_queue->SetCurrentLocate(), (ret = m_input_statement.Action()) == COMPILE_OK) {
        m_input_statement.LogOutput();
        goto SEMICOLON_CHECK;
    } else if (handle_correct_queue->SetCurrentLocate(), (ret = m_return_statement.Action(function_type, funtion_name)) == COMPILE_OK) {
        m_return_statement.LogOutput();
        goto SEMICOLON_CHECK;
    } else if (handle_correct_queue->SetCurrentLocate(), (ret = m_assign_statement.Action()) == COMPILE_OK) {
        m_assign_statement.LogOutput();
        goto SEMICOLON_CHECK;
    } else if (handle_correct_queue->SetCurrentLocate(), (ret = m_function_call.Action()) == COMPILE_OK) {
        m_function_call.LogOutput();
        goto SEMICOLON_CHECK;
    } else if (handle_correct_queue->SetCurrentLocate(), (ret = m_condition_statement.Action()) == COMPILE_OK) {
        m_condition_statement.LogOutput();
        goto NO_SEMICOLON;
    } else if (handle_correct_queue->SetCurrentLocate(), (ret = m_while_loop_statement.Action()) == COMPILE_OK) {
        m_while_loop_statement.LogOutput();
        goto NO_SEMICOLON;
    } else if (handle_correct_queue->SetCurrentLocate(), (ret = m_switch_statement.Action()) == COMPILE_OK) {
        m_switch_statement.LogOutput();
        goto NO_SEMICOLON;
    } else {
        name = handle_correct_queue->GetCurrentName();
        if (name == SEMICOLON_SYM) {
            handle_correct_queue->NextSymbol();
            string str("This is a empty statement");
            return COMPILE_OK;
        } else {
            return NOT_MATCH;
        }
    }
    SEMICOLON_CHECK:
        name = handle_correct_queue->GetCurrentName();
        if (name == SEMICOLON_SYM) {
            handle_correct_queue->NextSymbol();
            return COMPILE_OK;
        } else {
            fprintf(stderr, "expected a ':' in the end of statement\n");
            return COMPILE_OK;
        }
    NO_SEMICOLON:
        return COMPILE_OK;
}